

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_test.cc
# Opt level: O2

void __thiscall
phmap::priv::anon_unknown_0::Btree_UserProvidedKeyCompareToComparators_Test::
~Btree_UserProvidedKeyCompareToComparators_Test
          (Btree_UserProvidedKeyCompareToComparators_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Btree, UserProvidedKeyCompareToComparators) {
        phmap::btree_set<int, KeyCompareToWeakOrdering> weak_set = {1, 2, 3};
        EXPECT_TRUE(weak_set.contains(2));
        EXPECT_FALSE(weak_set.contains(4));

        phmap::btree_set<int, KeyCompareToStrongOrdering> strong_set = {1, 2, 3};
        EXPECT_TRUE(strong_set.contains(2));
        EXPECT_FALSE(strong_set.contains(4));
    }